

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Resupply_Received_PDU::Decode
          (Resupply_Received_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  byte bVar1;
  KUINT16 KVar2;
  KException *pKVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  allocator<char> local_49;
  Supplies sup;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x1b < iVar4 + (uint)KVar2) {
    Logistics_Header::Decode(&this->super_Logistics_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&this->m_ui8NumSupplyTypes);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    KDataStream::Read(stream,&this->m_ui8Padding2);
    KVar2 = KDataStream::GetBufferSize(stream);
    bVar1 = this->m_ui8NumSupplyTypes;
    if ((ushort)((ushort)bVar1 * 0xc) <= KVar2) {
      for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 1) {
        DATA_TYPE::Supplies::Supplies(&sup);
        (*sup.super_EntityType.super_DataTypeBase._vptr_DataTypeBase[3])(&sup,stream);
        std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
        push_back(&this->m_vSupplies,&sup);
        DATA_TYPE::Supplies::~Supplies(&sup);
        bVar1 = this->m_ui8NumSupplyTypes;
      }
      return;
    }
    pKVar3 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&sup,"Decode",&local_49);
    KException::KException(pKVar3,(KString *)&sup,0x1c);
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  pKVar3 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sup,"Decode",&local_49);
  KException::KException(pKVar3,(KString *)&sup,2);
  __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
}

Assistant:

void Resupply_Received_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < RESUPPLY_RECEIVED_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumSupplyTypes
           >> m_ui16Padding1
           >> m_ui8Padding2;

    // Now recheck the size of the packet as we now know the number of supply types.
    if( stream.GetBufferSize() < m_ui8NumSupplyTypes * Supplies::SUPPLIES_SIZE )throw KException( __FUNCTION__, RESUPPLY_RECEIVED_PDU_SIZE );

    for( KUINT16 i = 0; i < m_ui8NumSupplyTypes; ++i )
    {
        Supplies sup;
        stream >> KDIS_STREAM sup;
        m_vSupplies.push_back( sup );
    }
}